

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_math.cxx
# Opt level: O0

void ndiRelativeTransform(double *a,double *b,double *c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double z2;
  double y2;
  double x2;
  double w2;
  double z1;
  double y1;
  double x1;
  double w1;
  double z;
  double y;
  double x;
  double f;
  double *c_local;
  double *b_local;
  double *a_local;
  
  dVar1 = *b;
  dVar2 = b[1];
  dVar3 = b[2];
  dVar4 = b[3];
  dVar5 = *a;
  dVar6 = a[1];
  dVar7 = a[2];
  dVar8 = a[3];
  *c = dVar4 * dVar8 + dVar3 * dVar7 + dVar1 * dVar5 + dVar2 * dVar6;
  c[1] = dVar4 * dVar7 + -dVar3 * dVar8 + dVar1 * dVar6 + -(dVar2 * dVar5);
  c[2] = -dVar4 * dVar6 + -dVar3 * dVar5 + dVar1 * dVar7 + dVar2 * dVar8;
  c[3] = -dVar4 * dVar5 + dVar3 * dVar6 + dVar1 * dVar8 + -(dVar2 * dVar7);
  dVar5 = a[4] - b[4];
  dVar6 = a[5] - b[5];
  dVar7 = a[6] - b[6];
  dVar8 = dVar4 * dVar7 + dVar2 * dVar5 + dVar3 * dVar6;
  dVar9 = dVar4 * dVar6 + dVar1 * dVar5 + -(dVar3 * dVar7);
  dVar10 = -dVar4 * dVar5 + dVar1 * dVar6 + dVar2 * dVar7;
  dVar5 = dVar3 * dVar5 + dVar1 * dVar7 + -(dVar2 * dVar6);
  dVar6 = 1.0 / (dVar4 * dVar4 + dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2);
  c[4] = (-dVar5 * dVar3 + dVar10 * dVar4 + dVar8 * dVar2 + dVar9 * dVar1) * dVar6;
  c[5] = (dVar5 * dVar2 + dVar10 * dVar1 + dVar8 * dVar3 + -(dVar9 * dVar4)) * dVar6;
  c[6] = (dVar5 * dVar1 + -dVar10 * dVar2 + dVar8 * dVar4 + dVar9 * dVar3) * dVar6;
  c[7] = 0.0;
  return;
}

Assistant:

ndicapiExport void ndiRelativeTransform(const double a[8], const double b[8], double c[8])
{
  double f, x, y, z, w1, x1, y1, z1, w2, x2, y2, z2;

  w1 = b[0];
  x1 = b[1];
  y1 = b[2];
  z1 = b[3];

  w2 = a[0];
  x2 = a[1];
  y2 = a[2];
  z2 = a[3];

  /* for rotation part of transformation:
     q = q1\q2  (divide on the right to get new orientation) */
  c[0] = w1 * w2 + x1 * x2 + y1 * y2 + z1 * z2;
  c[1] = w1 * x2 - x1 * w2 - y1 * z2 + z1 * y2;
  c[2] = w1 * y2 + x1 * z2 - y1 * w2 - z1 * x2;
  c[3] = w1 * z2 - x1 * y2 + y1 * x2 - z1 * w2;

  /* several steps required to calculate new translation: */

  /* distance between tools */
  x = a[4] - b[4];
  y = a[5] - b[5];
  z = a[6] - b[6];

  /* q = q1\q*q1 (apply inverse of reference tranformation to distance) */

  /* first:  qtmp = q1\q */
  w2 = x1 * x + y1 * y + z1 * z;
  x2 = w1 * x - y1 * z + z1 * y;
  y2 = w1 * y + x1 * z - z1 * x;
  z2 = w1 * z - x1 * y + y1 * x;

  /* next:  q = qtmp*q1 */
  x = w2 * x1 + x2 * w1 + y2 * z1 - z2 * y1;
  y = w2 * y1 - x2 * z1 + y2 * w1 + z2 * x1;
  z = w2 * z1 + x2 * y1 - y2 * x1 + z2 * w1;

  /* find the normalization factor for q1 */
  f = 1.0f / (w1 * w1 + x1 * x1 + y1 * y1 + z1 * z1);
  c[4] = x * f;
  c[5] = y * f;
  c[6] = z * f;

  c[7] = 0.0;
}